

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

LIBSSH2_SFTP_HANDLE *
libssh2_sftp_open_ex_r
          (LIBSSH2_SFTP *sftp,char *filename,size_t filename_len,unsigned_long flags,long mode,
          int open_type,LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  int iVar1;
  time_t start_time;
  LIBSSH2_SFTP_HANDLE *pLVar2;
  int rc;
  time_t entry_time;
  LIBSSH2_SFTP_HANDLE *hnd;
  int open_type_local;
  long mode_local;
  unsigned_long flags_local;
  size_t filename_len_local;
  char *filename_local;
  LIBSSH2_SFTP *sftp_local;
  
  if (sftp != (LIBSSH2_SFTP *)0x0) {
    start_time = time((time_t *)0x0);
    do {
      pLVar2 = sftp_open(sftp,filename,filename_len,(uint32_t)flags,mode,open_type,attrs);
      if (sftp->channel->session->api_block_mode == 0) {
        return pLVar2;
      }
      if (pLVar2 != (LIBSSH2_SFTP_HANDLE *)0x0) {
        return pLVar2;
      }
      iVar1 = libssh2_session_last_errno(sftp->channel->session);
      if (iVar1 != -0x25) {
        return (LIBSSH2_SFTP_HANDLE *)0x0;
      }
      iVar1 = _libssh2_wait_socket(sftp->channel->session,start_time);
    } while (iVar1 == 0);
  }
  return (LIBSSH2_SFTP_HANDLE *)0x0;
}

Assistant:

LIBSSH2_API LIBSSH2_SFTP_HANDLE *
libssh2_sftp_open_ex_r(LIBSSH2_SFTP *sftp, const char *filename,
                       size_t filename_len, unsigned long flags, long mode,
                       int open_type, LIBSSH2_SFTP_ATTRIBUTES *attrs)
{
    LIBSSH2_SFTP_HANDLE *hnd;

    if(!sftp)
        return NULL;

    BLOCK_ADJUST_ERRNO(hnd, sftp->channel->session,
                       sftp_open(sftp, filename, filename_len, (uint32_t)flags,
                                 mode, open_type, attrs));
    return hnd;
}